

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

void Lf_ManCountMapRefs(Lf_Man_t *p)

{
  Tim_Man_t *p_00;
  undefined8 uVar1;
  Gia_Obj_t *pGVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Gia_Obj_t *pObj;
  int *piVar8;
  Gia_Man_t *pGVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  Jf_Par_t *pJVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pGVar9 = p->pGia;
  pVVar10 = pGVar9->vCos;
  if (pVVar10->nSize < 1) {
    uVar7 = 0;
  }
  else {
    lVar15 = 0;
    uVar7 = 0;
    do {
      iVar5 = pVVar10->pArray[lVar15];
      if (((long)iVar5 < 0) || (pGVar9->nObjs <= iVar5)) goto LAB_006dd0d3;
      uVar4 = Lf_ObjCoArrival2_rec
                        (p,pGVar9->pObjs + iVar5 +
                           -(ulong)((uint)*(undefined8 *)(pGVar9->pObjs + iVar5) & 0x1fffffff));
      if ((int)uVar7 <= (int)uVar4) {
        uVar7 = uVar4;
      }
      lVar15 = lVar15 + 1;
      pGVar9 = p->pGia;
      pVVar10 = pGVar9->vCos;
    } while (lVar15 < pVVar10->nSize);
  }
  pJVar12 = p->pPars;
  uVar14 = pJVar12->DelayTarget;
  uVar4 = uVar7;
  if (pJVar12->DelayTarget == 0xffffffff) {
    if (pJVar12->nRelaxRatio == 0) goto LAB_006dca7c;
    uVar14 = (uint)((((double)pJVar12->nRelaxRatio + 100.0) * (double)(int)uVar7) / 100.0);
    pJVar12->DelayTarget = uVar14;
    if (uVar14 == 0xffffffff) goto LAB_006dca7c;
  }
  uVar4 = uVar14;
  uVar11 = (ulong)uVar4;
  if (((double)(int)uVar4 + 0.01 <= (double)(int)uVar7) &&
     (uVar4 = uVar7, pJVar12->nRelaxRatio == 0)) {
    Abc_Print(0,"Relaxing user-specified delay target from %d to %d.\n",uVar11,(ulong)uVar7);
    pGVar9 = p->pGia;
    pJVar12 = p->pPars;
  }
LAB_006dca7c:
  pJVar12->Delay = (long)(int)uVar4;
  p->Switches = 0.0;
  pJVar12->Mux7 = 0;
  pJVar12->Area = 0;
  pJVar12->Edge = 0;
  uVar7 = pGVar9->nObjs;
  if ((p->vRequired).nCap < (int)uVar7) {
    piVar8 = (p->vRequired).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar7 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar7 << 2);
    }
    (p->vRequired).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRequired).nCap = uVar7;
  }
  auVar3 = _DAT_007ee2e0;
  if (0 < (int)uVar7) {
    piVar8 = (p->vRequired).pArray;
    lVar15 = (ulong)uVar7 - 1;
    auVar19._8_4_ = (int)lVar15;
    auVar19._0_8_ = lVar15;
    auVar19._12_4_ = (int)((ulong)lVar15 >> 0x20);
    lVar15 = 0;
    auVar19 = auVar19 ^ _DAT_007ee2e0;
    auVar20 = _DAT_007ee2c0;
    auVar21 = _DAT_007ee2d0;
    do {
      auVar22 = auVar21 ^ auVar3;
      iVar5 = auVar19._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar5 && auVar19._0_4_ < auVar22._0_4_ || iVar5 < auVar22._4_4_)
                & 1)) {
        *(undefined4 *)((long)piVar8 + lVar15) = 1000000000;
      }
      if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
          auVar22._12_4_ <= auVar19._12_4_) {
        *(undefined4 *)((long)piVar8 + lVar15 + 4) = 1000000000;
      }
      auVar22 = auVar20 ^ auVar3;
      iVar6 = auVar22._4_4_;
      if (iVar6 <= iVar5 && (iVar6 != iVar5 || auVar22._0_4_ <= auVar19._0_4_)) {
        *(undefined4 *)((long)piVar8 + lVar15 + 8) = 1000000000;
        *(undefined4 *)((long)piVar8 + lVar15 + 0xc) = 1000000000;
      }
      lVar16 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar16 + 4;
      lVar16 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar16 + 4;
      lVar15 = lVar15 + 0x10;
    } while ((ulong)(uVar7 + 3 >> 2) << 4 != lVar15);
  }
  (p->vRequired).nSize = uVar7;
  pGVar9 = p->pGia;
  if (p->pPars->fUseMux7 != 0) {
    Gia_ManCleanMark0(pGVar9);
    pGVar9 = p->pGia;
  }
  if ((Tim_Man_t *)pGVar9->pManTime == (Tim_Man_t *)0x0) {
    pVVar10 = pGVar9->vCos;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        iVar5 = pVVar10->pArray[lVar15];
        lVar16 = (long)iVar5;
        if ((lVar16 < 0) || (pGVar9->nObjs <= iVar5)) goto LAB_006dd0d3;
        uVar14 = (uint)*(undefined8 *)(pGVar9->pObjs + lVar16);
        uVar7 = uVar4;
        if (p->pPars->fDoAverage != 0) {
          iVar6 = Lf_ObjArrival_rec(p,pGVar9->pObjs + (lVar16 - (ulong)(uVar14 & 0x1fffffff)));
          uVar7 = (uint)((((double)p->pPars->nRelaxRatio + 100.0) * (double)iVar6) / 100.0);
        }
        uVar14 = iVar5 - (uVar14 & 0x1fffffff);
        if (((int)uVar14 < 0) || ((p->vRequired).nSize <= (int)uVar14)) goto LAB_006dd0f2;
        piVar8 = (p->vRequired).pArray;
        if ((int)uVar7 < piVar8[uVar14]) {
          piVar8[uVar14] = uVar7;
        }
        lVar15 = lVar15 + 1;
        pGVar9 = p->pGia;
        pVVar10 = pGVar9->vCos;
      } while (lVar15 < pVVar10->nSize);
    }
    lVar15 = (long)pGVar9->nObjs;
    if (1 < lVar15) {
      uVar11 = lVar15 + 1;
      lVar15 = lVar15 * 3;
      do {
        uVar17 = uVar11 - 1;
        if ((long)p->pGia->nObjs < (long)uVar17) goto LAB_006dd0d3;
        pGVar2 = p->pGia->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        uVar1 = *(undefined8 *)(&pGVar2[-1].field_0x0 + lVar15 * 4);
        uVar7 = (uint)uVar1;
        if ((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) {
          uVar7 = uVar7 & 0x1fffffff;
          if ((uVar7 == 0x1fffffff) || (uVar7 != ((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff))) {
            if ((long)(p->vOffsets).nSize < (long)uVar17) goto LAB_006dd0f2;
            iVar5 = (p->vOffsets).pArray[uVar11 - 2];
            if (((long)iVar5 < 0) || ((p->vMapRefs).nSize <= iVar5)) goto LAB_006dd0f2;
            if ((p->vMapRefs).pArray[iVar5] != 0) {
              Lf_ManCountMapRefsOne(p,(int)uVar11 + -2);
            }
          }
          else {
            uVar4 = (p->vRequired).nSize;
            if ((long)(int)uVar4 < (long)uVar17) goto LAB_006dd0f2;
            uVar13 = (-uVar7 + uVar11) - 2;
            uVar7 = (uint)uVar13;
            if (((int)uVar7 < 0) || (uVar4 <= uVar7)) goto LAB_006dd0f2;
            piVar8 = (p->vRequired).pArray;
            uVar13 = uVar13 & 0xffffffff;
            if (piVar8[uVar11 - 2] < piVar8[uVar13]) {
              piVar8[uVar13] = piVar8[uVar11 - 2];
            }
          }
        }
        uVar11 = uVar17;
        lVar15 = lVar15 + -3;
      } while (2 < uVar17);
    }
  }
  else {
    Tim_ManIncrementTravId((Tim_Man_t *)pGVar9->pManTime);
    pGVar9 = p->pGia;
    if (p->pPars->fDoAverage == 0) {
      Tim_ManInitPoRequiredAll((Tim_Man_t *)pGVar9->pManTime,(float)(int)uVar4);
      pGVar9 = p->pGia;
    }
    else {
      pVVar10 = pGVar9->vCos;
      if (0 < pVVar10->nSize) {
        lVar15 = 0;
        do {
          iVar5 = pVVar10->pArray[lVar15];
          if (((long)iVar5 < 0) || (pGVar9->nObjs <= iVar5)) goto LAB_006dd0d3;
          p_00 = (Tim_Man_t *)pGVar9->pManTime;
          iVar5 = Lf_ObjArrival_rec(p,pGVar9->pObjs + iVar5 +
                                      -(ulong)((uint)*(undefined8 *)(pGVar9->pObjs + iVar5) &
                                              0x1fffffff));
          Tim_ManSetCoRequired
                    (p_00,(int)lVar15,
                     (float)(int)((((double)p->pPars->nRelaxRatio + 100.0) * (double)iVar5) / 100.0)
                    );
          lVar15 = lVar15 + 1;
          pGVar9 = p->pGia;
          pVVar10 = pGVar9->vCos;
        } while (lVar15 < pVVar10->nSize);
      }
    }
    lVar15 = (long)pGVar9->nObjs;
    if (1 < lVar15) {
      uVar11 = lVar15 + 1;
      lVar15 = lVar15 * 3;
      do {
        uVar17 = uVar11 - 1;
        pGVar9 = p->pGia;
        if ((long)pGVar9->nObjs < (long)uVar17) {
LAB_006dd0d3:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = pGVar9->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        uVar13 = *(ulong *)(&pGVar2[-1].field_0x0 + lVar15 * 4);
        uVar4 = (uint)(uVar13 >> 0x20) & 0x1fffffff;
        uVar7 = (uint)uVar13;
        if ((((int)uVar7 < 0) || (uVar14 = uVar7 & 0x1fffffff, uVar14 == 0x1fffffff)) ||
           (uVar14 != uVar4)) {
          if ((uVar13 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
            if ((~uVar7 & 0x9fffffff) == 0) {
              if (-1 < (int)uVar7) {
                __assert_fail("pObj->fTerm",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x1ac,"int Gia_ObjCioId(Gia_Obj_t *)");
              }
              if ((long)(p->vRequired).nSize < (long)uVar17) goto LAB_006dd0f2;
              Tim_ManSetCiRequired
                        ((Tim_Man_t *)pGVar9->pManTime,uVar4,
                         (float)(p->vRequired).pArray[uVar11 - 2]);
            }
            else {
              if ((-1 < (int)uVar7) || ((int)(uVar13 & 0x1fffffff) == 0x1fffffff)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                              ,0x668,"void Lf_ManCountMapRefs(Lf_Man_t *)");
              }
              fVar18 = Tim_ManGetCoRequired((Tim_Man_t *)pGVar9->pManTime,uVar4);
              uVar11 = (-(*(uint *)(&pGVar2[-1].field_0x0 + lVar15 * 4) & 0x1fffffff) + uVar11) - 2;
              iVar5 = (int)uVar11;
              if ((iVar5 < 0) || ((p->vRequired).nSize <= iVar5)) goto LAB_006dd0f2;
              piVar8 = (p->vRequired).pArray;
              uVar11 = uVar11 & 0xffffffff;
              if ((int)fVar18 < piVar8[uVar11]) {
                piVar8[uVar11] = (int)fVar18;
              }
            }
          }
          else {
            if ((long)(p->vOffsets).nSize < (long)uVar17) {
LAB_006dd0f2:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar5 = (p->vOffsets).pArray[uVar11 - 2];
            if (((long)iVar5 < 0) || ((p->vMapRefs).nSize <= iVar5)) goto LAB_006dd0f2;
            if ((p->vMapRefs).pArray[iVar5] != 0) {
              Lf_ManCountMapRefsOne(p,(int)uVar11 + -2);
            }
          }
        }
        else {
          uVar7 = (p->vRequired).nSize;
          if ((long)(int)uVar7 < (long)uVar17) goto LAB_006dd0f2;
          uVar13 = (uVar11 + -uVar14) - 2;
          uVar4 = (uint)uVar13;
          if (((int)uVar4 < 0) || (uVar7 <= uVar4)) goto LAB_006dd0f2;
          piVar8 = (p->vRequired).pArray;
          uVar13 = uVar13 & 0xffffffff;
          if (piVar8[uVar11 - 2] < piVar8[uVar13]) {
            piVar8[uVar13] = piVar8[uVar11 - 2];
          }
        }
        uVar11 = uVar17;
        lVar15 = lVar15 + -3;
      } while (2 < uVar17);
    }
  }
  if (p->pPars->fUseMux7 != 0) {
    Gia_ManCleanMark0(p->pGia);
    return;
  }
  return;
}

Assistant:

void Lf_ManCountMapRefs( Lf_Man_t * p )
{
    // compute delay
    Gia_Obj_t * pObj;
    int i, Id, Delay = 0;
    for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
        Delay = Abc_MaxInt( Delay, Lf_ObjCoArrival2(p, i) );
    // check delay target
    if ( p->pPars->DelayTarget == -1 && p->pPars->nRelaxRatio )
        p->pPars->DelayTarget = (int)((float)Delay * (100.0 + p->pPars->nRelaxRatio) / 100.0);
    if ( p->pPars->DelayTarget != -1 )
    {
        if ( Delay < p->pPars->DelayTarget + 0.01 )
            Delay = p->pPars->DelayTarget;
        else if ( p->pPars->nRelaxRatio == 0 )
            Abc_Print( 0, "Relaxing user-specified delay target from %d to %d.\n", p->pPars->DelayTarget, Delay );
    }
    p->pPars->Delay = Delay;
    // compute area/edges/required
    p->pPars->Mux7 = p->pPars->Area = p->pPars->Edge = p->Switches = 0;
    Vec_IntFill( &p->vRequired, Gia_ManObjNum(p->pGia), ABC_INFINITY );
    if ( p->pPars->fUseMux7 )
        Gia_ManCleanMark0(p->pGia);
    if ( p->pGia->pManTime != NULL )
    {
        Tim_ManIncrementTravId( (Tim_Man_t*)p->pGia->pManTime );
        if ( p->pPars->fDoAverage )
            for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
               Tim_ManSetCoRequired( (Tim_Man_t*)p->pGia->pManTime, i, (int)(Lf_ObjCoArrival(p, i) * (100.0 + p->pPars->nRelaxRatio) / 100.0) );
        else  
            Tim_ManInitPoRequiredAll( (Tim_Man_t*)p->pGia->pManTime, Delay );
        Gia_ManForEachObjReverse1( p->pGia, pObj, i )
        {
            if ( Gia_ObjIsBuf(pObj) )
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), Lf_ObjRequired(p, i) );
            else if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Lf_ObjMapRefNum(p, i) )
                    Lf_ManCountMapRefsOne( p, i );
            }
            else if ( Gia_ObjIsCi(pObj) )
                Tim_ManSetCiRequired( (Tim_Man_t*)p->pGia->pManTime, Gia_ObjCioId(pObj), Lf_ObjRequired(p, i) );
            else if ( Gia_ObjIsCo(pObj) )
            {
                int reqTime = Tim_ManGetCoRequired( (Tim_Man_t*)p->pGia->pManTime, Gia_ObjCioId(pObj) );
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), reqTime );
            }
            else assert( 0 );
        }
    }
    else
    {
        Gia_ManForEachCoDriverId( p->pGia, Id, i )
            Lf_ObjSetRequired( p, Id, p->pPars->fDoAverage ? (int)(Lf_ObjCoArrival(p, i) * (100.0 + p->pPars->nRelaxRatio) / 100.0) : Delay );
        Gia_ManForEachAndReverse( p->pGia, pObj, i )
            if ( Gia_ObjIsBuf(pObj) )
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), Lf_ObjRequired(p, i) );
            else if ( Lf_ObjMapRefNum(p, i) )
                Lf_ManCountMapRefsOne( p, i );
    }
    if ( p->pPars->fUseMux7 )
        Gia_ManCleanMark0(p->pGia);
}